

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

result __thiscall
dtc::anon_unknown_1::divmod<std::divides<unsigned_long_long>_>::operator()
          (divmod<std::divides<unsigned_long_long>_> *this)

{
  int iVar1;
  undefined4 extraout_var;
  byte extraout_DL;
  result rVar2;
  
  iVar1 = (**((this->super_binary_operator<5,_std::divides<unsigned_long_long>_>).
              super_binary_operator_base.rhs._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  if ((CONCAT44(extraout_var,iVar1) == 0 & extraout_DL) == 1) {
    text_input_buffer::source_location::report_error
              (&(this->super_binary_operator<5,_std::divides<unsigned_long_long>_>).
                super_binary_operator_base.super_expression.loc,"Division by zero");
    rVar2 = (result)ZEXT816(0);
  }
  else {
    rVar2 = binary_operator<5,_std::divides<unsigned_long_long>_>::operator()
                      (&this->super_binary_operator<5,_std::divides<unsigned_long_long>_>);
  }
  return rVar2;
}

Assistant:

result operator()() override
	{
		result r = (*binary_operator_base::rhs)();
		if (r.second && (r.first == 0))
		{
			expression::loc.report_error("Division by zero");
			return {0, false};
		}
		return binary_operator<5, T>::operator()();
	}